

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

iuIParamGenerator<int> * __thiscall
iutest::detail::iuValuesParamsGeneratorHolder::operator_cast_to_iuIParamGenerator_
          (iuValuesParamsGeneratorHolder *this)

{
  iuIParamGenerator<int> *piVar1;
  vector<int,_std::allocator<int>_> params;
  allocator_type local_29;
  vector<int,_std::allocator<int>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_28,*(size_type *)this,&local_29);
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,iutest::detail::iuTypedRandom<int>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(iuTypedRandom<int>)*(Engine *)(this + 8));
  piVar1 = (iuIParamGenerator<int> *)operator_new(0x28);
  piVar1->_vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_001b5cd8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(piVar1 + 1),&local_28);
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)0x0;
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return piVar1;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        ::std::vector<T> params(m_num);
        ::std::generate(params.begin(), params.end(), m_g);
        return new iuValuesInParamsGenerator<T>( params );
    }